

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpConnector.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int isUnix;
  sbfTcpConnectionAddress address;
  sbfTcpConnection connection;
  sbfLog log;
  sbfKeyValue properties;
  sbfThread t;
  sbfQueue queue;
  sbfMw mw;
  undefined2 local_b8;
  char acStack_b6 [110];
  long local_48;
  undefined8 local_40;
  undefined8 local_38;
  pthread_t local_30;
  void *local_28;
  undefined8 local_20;
  undefined4 local_c;
  
  local_c = 0;
  local_40 = sbfLog_create(0,"sbf");
  sbfLog_setLevel(local_40,4);
  local_38 = sbfKeyValue_create();
  local_20 = sbfMw_create(local_40,local_38);
  local_28 = (void *)sbfQueue_create(local_20,"default");
  pthread_create(&local_30,(pthread_attr_t *)0x0,dispatchCb,local_28);
  memset(&local_b8,0,0x70);
  local_b8 = 1;
  strncpy(acStack_b6,"/tmp/test.sock",0x6b);
  uVar1 = local_40;
  uVar2 = sbfMw_getThread(local_20,0);
  local_48 = sbfTcpConnection_create
                       (uVar1,uVar2,local_28,&local_b8,1,0,onConnectionReady,onConnectionError,
                        onConnectionRead,0);
  if (local_48 == 0) {
    fprintf(_stderr,"failed to create connection to real time host");
  }
  else {
    sleep(10);
  }
  exit(0);
}

Assistant:

int
main (int argc, char** argv)
{
    sbfMw               mw;
    sbfQueue            queue;
    sbfThread           t;
    sbfKeyValue         properties;
    sbfLog              log;
    sbfTcpConnection    connection;

    log = sbfLog_create (NULL, "sbf");
    sbfLog_setLevel (log, SBF_LOG_OFF);

    properties = sbfKeyValue_create ();
    mw = sbfMw_create (log, properties);

    queue = sbfQueue_create (mw, "default");
    sbfThread_create (&t, dispatchCb, queue);

    sbfTcpConnectionAddress address;
    memset(&address, 0, sizeof(address));
    address.sun.sun_family = AF_UNIX;
    strncpy(address.sun.sun_path, "/tmp/test.sock", sizeof(address.sun.sun_path) - 1);
    int isUnix = 1;
    
    connection = sbfTcpConnection_create (log,
                                          sbfMw_getDefaultThread (mw),
                                          queue,
                                          &address,
                                          isUnix,
                                          0,
                                          onConnectionReady,
                                          onConnectionError,
                                          onConnectionRead,
                                          NULL);
    if (connection == NULL)
    {
        fprintf (stderr, "failed to create connection to real time host");
    }
    else
    {
        sleep(10);
    }
    
    exit (0);
}